

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O1

string_view slang::nextSegment(string_view *path)

{
  ulong uVar1;
  long lVar2;
  ulong in_RAX;
  char *in_RDX;
  ulong uVar3;
  bool bVar4;
  string_view sVar5;
  
  uVar1 = path->_M_len;
  bVar4 = uVar1 != 0;
  if (bVar4) {
    in_RDX = path->_M_str;
    if (*in_RDX == '/') {
      in_RAX = 0;
    }
    else {
      uVar3 = 0;
      do {
        if (uVar1 - 1 == uVar3) {
          bVar4 = false;
          goto LAB_001cc1b9;
        }
        in_RAX = uVar3 + 1;
        lVar2 = uVar3 + 1;
        uVar3 = in_RAX;
      } while (in_RDX[lVar2] != '/');
      bVar4 = in_RAX < uVar1;
    }
    uVar3 = in_RAX + 1;
    if (uVar1 < uVar3) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 uVar3);
    }
    if (uVar1 < in_RAX) {
      in_RAX = uVar1;
    }
    path->_M_len = uVar1 - uVar3;
    path->_M_str = in_RDX + uVar3;
  }
LAB_001cc1b9:
  if (!bVar4) {
    in_RAX = path->_M_len;
    in_RDX = path->_M_str;
    path->_M_len = 0;
    path->_M_str = (char *)0x0;
  }
  sVar5._M_str = in_RDX;
  sVar5._M_len = in_RAX;
  return sVar5;
}

Assistant:

static std::string_view nextSegment(std::string_view& path) {
    for (size_t i = 0; i < path.size(); i++) {
        // NOLINTNEXTLINE
        if (path[i] == fs::path::preferred_separator || path[i] == '/') {
            auto result = path.substr(0, i);
            path = path.substr(i + 1);
            return result;
        }
    }

    auto result = path;
    path = {};
    return result;
}